

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

void __thiscall QXcbScreen::updateGeometry(QXcbScreen *this,xcb_timestamp_t timestamp)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  QXcbConnection *this_00;
  QXcbScreen *this_01;
  xcb_connection_t *pxVar6;
  pointer pxVar7;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> crtc;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QXcbObject::connection((QXcbObject *)(in_RDI + 0x10));
  bVar2 = QXcbBasicConnection::isAtLeastXRandR12((QXcbBasicConnection *)this_00);
  if (bVar2) {
    this_01 = (QXcbScreen *)QXcbObject::xcb_connection((QXcbObject *)0x1cff7d);
    pxVar6 = QXcbObject::xcb_connection((QXcbObject *)0x1cff90);
    uVar3 = xcb_randr_get_crtc_info_unchecked(pxVar6,*(undefined4 *)(in_RDI + 0x34),in_ESI);
    xcb_randr_get_crtc_info_reply(this_01,uVar3,0);
    std::unique_ptr<xcb_randr_get_crtc_info_reply_t,QStdFreeDeleter>::
    unique_ptr<QStdFreeDeleter,void>
              ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (pointer)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1cffd1);
    if (bVar2) {
      pxVar7 = std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::operator->
                         ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1cffe1);
      in_stack_ffffffffffffffb4 = (int)pxVar7->x;
      pxVar7 = std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::operator->
                         ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1cfff3);
      iVar4 = (int)pxVar7->y;
      pxVar7 = std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::operator->
                         ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1d0005);
      uVar5 = (uint)pxVar7->width;
      std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::operator->
                ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1d0017);
      QRect::QRect((QRect *)CONCAT44(uVar5,iVar4),in_stack_ffffffffffffffb4,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::operator->
                ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)0x1d003c);
      updateGeometry(this_01,(QRect *)CONCAT44(uVar5,iVar4),
                     (uint8_t)((uint)in_stack_ffffffffffffffb4 >> 0x18));
    }
    std::unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter>::~unique_ptr
              ((unique_ptr<xcb_randr_get_crtc_info_reply_t,_QStdFreeDeleter> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbScreen::updateGeometry(xcb_timestamp_t timestamp)
{
    if (!connection()->isAtLeastXRandR12())
        return;

    auto crtc = Q_XCB_REPLY_UNCHECKED(xcb_randr_get_crtc_info, xcb_connection(),
                                      m_crtc, timestamp);
    if (crtc)
        updateGeometry(QRect(crtc->x, crtc->y, crtc->width, crtc->height), crtc->rotation);
}